

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp8e_vepu2_v2.c
# Opt level: O2

MPP_RET hal_vp8e_vepu2_gen_regs_v2(void *hal,HalEncTask *task)

{
  undefined1 uVar1;
  byte bVar2;
  byte bVar3;
  undefined2 uVar4;
  int iVar5;
  void *__s;
  MPP_RET MVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint *puVar22;
  int iVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  long lVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  
  iVar5 = (task->rc_task->info).quality_target;
  iVar23 = 0x7f;
  if (iVar5 < 0x7f) {
    iVar23 = iVar5;
  }
  iVar5 = 0;
  if (0 < iVar23) {
    iVar5 = iVar23;
  }
  *(int *)(*(long *)((long)hal + 0x158) + 0x18) = iVar5;
  if (*(int *)((long)hal + 0x6910) == 0) {
    MVar6 = hal_vp8e_setup(hal);
    if (MVar6 != MPP_OK) {
      _mpp_log_l(2,"hal_vp8e_vepu2_v2","failed to init hal vp8e\n",(char *)0x0);
      return MVar6;
    }
    *(undefined4 *)((long)hal + 0x6910) = 1;
  }
  *(undefined8 *)((long)hal + 0x68f8) = 0;
  *(undefined8 *)((long)hal + 0x6900) = 0;
  *(undefined8 *)((long)hal + 0x68e8) = 0;
  *(undefined8 *)((long)hal + 0x68f0) = 0;
  *(undefined4 *)((long)hal + 0x6908) = 0;
  hal_vp8e_enc_strm_code(hal,task);
  __s = *(void **)((long)hal + 0x58);
  memset(__s,0,0x2e0);
  *(uint *)((long)__s + 0x1b4) = (uint)(*(int *)((long)hal + 0x160) != 0) << 8;
  *(undefined4 *)((long)__s + 0xd8) = 0x1000;
  if ((*(uint *)((long)hal + 0x18c) < 4) || (*(uint *)((long)hal + 0x18c) < 7)) {
    *(undefined4 *)((long)__s + 0x1a4) = 0xfc000000;
  }
  else {
    *(undefined4 *)((long)__s + 0x1a4) = 0x3c000000;
  }
  *(undefined4 *)((long)__s + 0x134) = *(undefined4 *)((long)hal + 0x194);
  mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x50),0x4d,*(RK_U32 *)((long)hal + 0x198));
  iVar5 = *(int *)((long)hal + 0x1ac);
  *(int *)((long)__s + 0x138) = iVar5;
  *(uint *)((long)__s + 0x128) = *(uint *)((long)__s + 0x128) & 0xfffffffe | (uint)(iVar5 != 0);
  *(uint *)((long)__s + 0x1b4) =
       *(uint *)((long)__s + 0x1b4) & 0xfeffffff | (uint)(*(int *)((long)hal + 0x374) != 0) << 0x18;
  *(undefined4 *)((long)__s + 0xe0) = *(undefined4 *)((long)hal + 0x1c4);
  *(undefined4 *)((long)__s + 0xe4) = *(undefined4 *)((long)hal + 0x1cc);
  *(undefined4 *)((long)__s + 0xfc) = *(undefined4 *)((long)hal + 0x1bc);
  *(undefined4 *)((long)__s + 0x100) = *(undefined4 *)((long)hal + 0x1c0);
  *(undefined4 *)((long)__s + 0xc0) = *(undefined4 *)((long)hal + 0x1d4);
  if (*(RK_U32 *)((long)hal + 0x1d8) != 0) {
    mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x50),0x30,*(RK_U32 *)((long)hal + 0x1d8));
  }
  *(undefined4 *)((long)__s + 0xc4) = *(undefined4 *)((long)hal + 0x1dc);
  if (*(RK_U32 *)((long)hal + 0x1e0) != 0) {
    mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x50),0x31,*(RK_U32 *)((long)hal + 0x1e0));
  }
  *(undefined4 *)((long)__s + 200) = *(undefined4 *)((long)hal + 0x1e4);
  if (*(RK_U32 *)((long)hal + 0x1e8) != 0) {
    mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x50),0x32,*(RK_U32 *)((long)hal + 0x1e8));
  }
  uVar28 = *(uint *)((long)__s + 0x1b4);
  *(uint *)((long)__s + 0x1b4) = uVar28 | 0x400;
  uVar24 = (*(uint *)((long)hal + 0x1b0) & 1) << 0x10;
  *(uint *)((long)__s + 0x1b4) = uVar28 & 0xfffeffff | 0x400 | uVar24;
  *(uint *)((long)__s + 0x1b4) =
       uVar28 & 0xffeeffff | 0x400 | uVar24 | (*(uint *)((long)hal + 0x1b4) & 1) << 0x14;
  uVar24 = (*(uint *)((long)hal + 0x168) & 0x1ff) << 8;
  uVar28 = *(uint *)((long)__s + 0x19c);
  *(uint *)((long)__s + 0x19c) = uVar28 & 0xfffe00ff | uVar24;
  uVar26 = (*(uint *)((long)hal + 0x164) & 0x1ff) << 0x14;
  *(uint *)((long)__s + 0x19c) = uVar28 & 0xe00e00ff | uVar24 | uVar26;
  uVar27 = (*(uint *)((long)hal + 0x170) & 3) << 6;
  *(uint *)((long)__s + 0x19c) = uVar28 & 0xe00e003f | uVar24 | uVar26 | uVar27;
  *(uint *)((long)__s + 0x19c) =
       uVar28 & 0xe00e000f | uVar24 | uVar26 | uVar27 | (*(uint *)((long)hal + 0x174) & 3) << 4;
  uVar24 = (*(uint *)((long)hal + 0x2fc) & 7) << 0x14;
  uVar28 = *(uint *)((long)__s + 0xf4);
  *(uint *)((long)__s + 0xf4) = uVar28 & 0xff8fffff | uVar24;
  uVar26 = (*(uint *)((long)hal + 0x2f8) & 7) << 0x10;
  *(uint *)((long)__s + 0xf4) = uVar28 & 0xff88ffff | uVar24 | uVar26;
  *(uint *)((long)__s + 0xf4) =
       uVar28 & 0xff88c000 | uVar24 | uVar26 | *(uint *)((long)hal + 0x178) & 0x3fff;
  uVar28 = *(uint *)((long)__s + 0xf0);
  uVar7 = (*(uint *)((long)hal + 0x17c) & 3) << 4;
  *(uint *)((long)__s + 0xf0) = uVar28 & 0xffffffcf | uVar7;
  uVar8 = *(uint *)((long)hal + 0x180) & 0xf;
  *(uint *)((long)__s + 0xf0) = uVar28 & 0xffffffc0 | uVar7 | uVar8;
  uVar24 = *(uint *)((long)__s + 0x128);
  uVar26 = (*(uint *)((long)hal + 0x18c) & 0xf) << 4;
  *(uint *)((long)__s + 0x128) = uVar24 & 0xffffff0f | uVar26;
  *(uint *)((long)__s + 0x128) =
       (uVar24 & 0xffffff03 | uVar26) + (*(uint *)((long)hal + 400) & 3) * 4;
  uVar24 = *(uint *)((long)__s + 0xec);
  uVar26 = (*(uint *)((long)hal + 0x188) & 1) << 0x14;
  *(uint *)((long)__s + 0xec) = uVar24 & 0xffefffff | uVar26;
  iVar5 = *(int *)((long)hal + 0x310);
  *(short *)((long)__s + 0x12e) = (short)iVar5;
  *(uint *)((long)__s + 300) = (uint)*(ushort *)((long)hal + 0x318) | iVar5 << 0x10;
  uVar27 = (*(uint *)((long)hal + 0x300) & 1) << 0x1c;
  *(uint *)((long)__s + 0xec) = uVar24 & 0xefefffff | uVar26 | uVar27;
  *(uint *)((long)__s + 0xec) =
       uVar24 & 0xecefffff | uVar26 | uVar27 | (*(uint *)((long)hal + 0x184) & 3) << 0x18;
  uVar9 = (*(uint *)((long)hal + 0x31c) & 0xff) << 8;
  *(uint *)((long)__s + 0xf0) = uVar28 & 0xffff00c0 | uVar7 | uVar8 | uVar9;
  uVar24 = *(uint *)((long)__s + 0x18c);
  uVar10 = *(uint *)((long)hal + 0x4f0) & 1;
  *(uint *)((long)__s + 0x18c) = uVar24 & 0xfffffffe | uVar10;
  uVar27 = (*(uint *)((long)hal + 0x4f4) & 0x3ff) << 0x14;
  uVar26 = *(uint *)((long)__s + 0x1ac);
  *(uint *)((long)__s + 0x1ac) = uVar26 & 0xc00fffff | uVar27;
  uVar11 = (*(uint *)((long)hal + 0x4f8) & 0x3ff) << 10;
  *(uint *)((long)__s + 0x1ac) = uVar26 & 0xc00003ff | uVar27 | uVar11;
  *(uint *)((long)__s + 0x1ac) =
       uVar26 & 0xc0000000 | uVar27 | uVar11 | *(uint *)((long)hal + 0x4fc) & 0x3ff;
  uVar27 = (*(uint *)((long)hal + 0x500) & 0x1ff) << 0xb;
  uVar26 = *(uint *)((long)__s + 0x198);
  *(uint *)((long)__s + 0x198) = uVar26 & 0xfff007ff | uVar27;
  *(uint *)((long)__s + 0x198) =
       uVar26 & 0xff0007ff | uVar27 | (*(uint *)((long)hal + 0x4ec) & 0xf) << 0x14;
  *(undefined4 *)((long)__s + 0xcc) = *(undefined4 *)((long)hal + 0x1a4);
  *(undefined4 *)((long)__s + 0xd0) = *(undefined4 *)((long)hal + 0x1a8);
  *(undefined4 *)((long)__s + 0xd4) = *(undefined4 *)((long)hal + 0x19c);
  *(undefined4 *)((long)__s + 0x130) = *(undefined4 *)((long)hal + 0x1c8);
  *(undefined4 *)((long)__s + 0x1a8) = *(undefined4 *)((long)hal + 0x1d0);
  uVar12 = *(ushort *)((long)hal + 0x3d4) & 0x3fff;
  uVar26 = *(uint *)((long)__s + 400);
  *(uint *)((long)__s + 400) = uVar26 & 0xffffc000 | uVar12;
  uVar13 = *(ushort *)((long)hal + 0x3dc) & 0x3fff;
  uVar27 = *(uint *)((long)__s + 0x104);
  *(uint *)((long)__s + 0x104) = uVar27 & 0xffffc000 | uVar13;
  uVar14 = *(ushort *)((long)hal + 0x3e4) & 0x3fff;
  uVar11 = *(uint *)((long)__s + 0x108);
  *(uint *)((long)__s + 0x108) = uVar11 & 0xffffc000 | uVar14;
  uVar15 = *(ushort *)((long)hal + 0x3ec) & 0x3fff;
  uVar25 = *(uint *)((long)__s + 0x10c);
  *(uint *)((long)__s + 0x10c) = uVar25 & 0xffffc000 | uVar15;
  uVar30 = *(ushort *)((long)hal + 0x3f4) & 0x3fff;
  uVar32 = *(uint *)((long)__s + 0x110);
  *(uint *)((long)__s + 0x110) = uVar32 & 0xffffc000 | uVar30;
  uVar31 = *(ushort *)((long)hal + 0x3fc) & 0x3fff;
  uVar33 = *(uint *)((long)__s + 0x114);
  *(uint *)((long)__s + 0x114) = uVar33 & 0xffffc000 | uVar31;
  uVar16 = (*(ushort *)((long)hal + 0x404) & 0x1ff) << 0xe;
  *(uint *)((long)__s + 400) = uVar26 & 0xff800000 | uVar12 | uVar16;
  uVar17 = (*(ushort *)((long)hal + 0x40c) & 0x1ff) << 0xe;
  *(uint *)((long)__s + 0x104) = uVar27 & 0xff800000 | uVar13 | uVar17;
  uVar18 = (*(ushort *)((long)hal + 0x414) & 0x1ff) << 0xe;
  *(uint *)((long)__s + 0x108) = uVar11 & 0xff800000 | uVar14 | uVar18;
  uVar19 = (*(ushort *)((long)hal + 0x41c) & 0x1ff) << 0xe;
  *(uint *)((long)__s + 0x10c) = uVar25 & 0xff800000 | uVar15 | uVar19;
  uVar20 = (*(ushort *)((long)hal + 0x424) & 0x1ff) << 0xe;
  *(uint *)((long)__s + 0x110) = uVar32 & 0xff800000 | uVar30 | uVar20;
  uVar21 = (*(ushort *)((long)hal + 0x42c) & 0x1ff) << 0xe;
  *(uint *)((long)__s + 0x114) = uVar33 & 0xff800000 | uVar31 | uVar21;
  *(uint *)((long)__s + 400) =
       uVar26 & 0x80000000 | uVar12 | uVar16 | (uint)*(byte *)((long)hal + 0x434) << 0x17;
  *(uint *)((long)__s + 0x104) =
       uVar27 & 0x80000000 | uVar13 | uVar17 | (uint)*(byte *)((long)hal + 0x438) << 0x17;
  *(uint *)((long)__s + 0x108) =
       uVar11 & 0x80000000 | uVar14 | uVar18 | (uint)*(byte *)((long)hal + 0x43c) << 0x17;
  *(uint *)((long)__s + 0x10c) =
       uVar25 & 0x80000000 | uVar15 | uVar19 | (uint)*(byte *)((long)hal + 0x440) << 0x17;
  *(uint *)((long)__s + 0x110) =
       uVar32 & 0x80000000 | uVar30 | uVar20 | (uint)*(byte *)((long)hal + 0x444) << 0x17;
  *(uint *)((long)__s + 0x114) =
       uVar33 & 0x80000000 | uVar31 | uVar21 | (uint)*(byte *)((long)hal + 0x448) << 0x17;
  uVar27 = CONCAT31((int3)((uint)*(undefined4 *)((long)__s + 0x118) >> 8),
                    *(undefined1 *)((long)hal + 0x44c));
  *(uint *)((long)__s + 0x118) = uVar27;
  uVar11 = (*(ushort *)((long)hal + 0x454) & 0x1ff) << 8;
  *(uint *)((long)__s + 0x118) = uVar27 & 0xfffe00ff | uVar11;
  uVar25 = (*(ushort *)((long)hal + 0x45c) & 0x1ff) << 0x11;
  *(uint *)((long)__s + 0x118) = uVar27 & 0xfc0000ff | uVar11 | uVar25;
  uVar32 = *(ushort *)((long)hal + 0x464) & 0x1ff;
  uVar26 = *(uint *)((long)__s + 0x11c);
  *(uint *)((long)__s + 0x11c) = uVar26 & 0xfffffe00 | uVar32;
  uVar33 = (uint)*(byte *)((long)hal + 0x46c) << 9;
  *(uint *)((long)__s + 0x11c) = uVar26 & 0xfffe0000 | uVar32 | uVar33;
  uVar12 = (*(ushort *)((long)hal + 0x474) & 0x1ff) << 0x11;
  *(uint *)((long)__s + 0x11c) = uVar26 & 0xfc000000 | uVar32 | uVar33 | uVar12;
  *(uint *)((long)__s + 0x118) =
       uVar27 & 0xf00000ff | uVar11 | uVar25 | (*(uint *)((long)hal + 0x484) & 3) << 0x1a;
  uVar27 = (*(uint *)((long)hal + 0x488) & 3) << 0x1a;
  *(uint *)((long)__s + 0x11c) = uVar26 & 0xf0000000 | uVar32 | uVar33 | uVar12 | uVar27;
  *(uint *)((long)__s + 0x11c) =
       uVar26 & 0xe0000000 | uVar32 | uVar33 | uVar12 | uVar27 |
       (*(uint *)((long)hal + 0x48c) & 1) << 0x1c;
  *(undefined4 *)((long)__s + 0x120) = *(undefined4 *)((long)hal + 0x490);
  uVar26 = *(uint *)((long)__s + 0x124) & 0xffffe0ff | (*(uint *)((long)hal + 0x494) & 0x1f) << 8;
  *(uint *)((long)__s + 0x124) = uVar26;
  uVar26 = CONCAT31((int3)(uVar26 >> 8),*(undefined1 *)((long)hal + 0x498));
  *(uint *)((long)__s + 0x124) = uVar26;
  uVar27 = (*(uint *)((long)hal + 0x4a0) & 0x3f) << 0xf;
  *(uint *)((long)__s + 0x124) = uVar26 & 0xffe07fff | uVar27;
  uVar11 = *(int *)((long)hal + 800) << 0x18;
  *(uint *)((long)__s + 0x124) = uVar26 & 0xe07fff | uVar27 | uVar11;
  uVar25 = (*(uint *)((long)hal + 0x4b0) & 7) << 0x15;
  *(uint *)((long)__s + 0x124) = uVar26 & 0x7fff | uVar27 | uVar11 | uVar25;
  *(uint *)((long)__s + 0x124) =
       uVar26 & 0x1fff | uVar27 | uVar11 | uVar25 | (*(uint *)((long)hal + 0x49c) & 3) << 0xd;
  *(uint *)((long)__s + 0xf0) =
       uVar28 & 0xffc000c0 | uVar7 | uVar8 | uVar9 | (*(uint *)((long)hal + 0x1a0) & 0x3f) << 0x10;
  *(undefined4 *)((long)__s + 0x13c) = *(undefined4 *)((long)hal + 0x304);
  *(uint *)((long)__s + 0x178) =
       *(uint *)((long)__s + 0x178) & 0xffffff3f | (*(uint *)((long)hal + 0x308) & 3) << 6;
  uVar28 = (uVar24 & 0xfffff800 | uVar10) + (*(uint *)((long)hal + 0x324) & 0x3ff) * 2;
  *(uint *)((long)__s + 0x18c) = uVar28;
  uVar24 = (*(uint *)((long)hal + 0x328) & 0x3ff) << 0x15;
  *(uint *)((long)__s + 0x18c) = uVar28 & 0x801fffff | uVar24;
  *(uint *)((long)__s + 0x18c) =
       uVar28 & 0x800007ff | uVar24 | (*(uint *)((long)hal + 0x32c) & 0x3ff) << 0xb;
  *(undefined4 *)((long)__s + 0x144) = *(undefined4 *)((long)hal + 0x378);
  *(undefined4 *)((long)__s + 0x140) = *(undefined4 *)((long)hal + 0x374);
  uVar4 = *(undefined2 *)((long)hal + 900);
  *(undefined2 *)((long)__s + 0x17c) = uVar4;
  *(uint *)((long)__s + 0x17c) = CONCAT22(*(undefined2 *)((long)hal + 0x386),uVar4);
  uVar4 = *(undefined2 *)((long)hal + 0x388);
  *(undefined2 *)((long)__s + 0x180) = uVar4;
  *(uint *)((long)__s + 0x180) = CONCAT22(*(undefined2 *)((long)hal + 0x38a),uVar4);
  *(undefined2 *)((long)__s + 0x184) = *(undefined2 *)((long)hal + 0x38c);
  uVar28 = *(uint *)((long)__s + 0x188);
  uVar24 = *(byte *)((long)hal + 0x38e) & 0x1f;
  *(uint *)((long)__s + 0x188) = uVar28 & 0xffffffe0 | uVar24;
  uVar26 = (*(byte *)((long)hal + 0x38f) & 0x1f) << 8;
  *(uint *)((long)__s + 0x188) = uVar28 & 0xffffe0e0 | uVar24 | uVar26;
  *(uint *)((long)__s + 0x188) =
       uVar28 & 0xffe0e0e0 | uVar24 | uVar26 | (*(byte *)((long)hal + 0x390) & 0x1f) << 0x10;
  iVar5 = *(int *)((long)hal + 0x334);
  *(short *)((long)__s + 0xbe) = (short)iVar5;
  *(uint *)((long)__s + 0xbc) = (uint)*(ushort *)((long)hal + 0x338) | iVar5 << 0x10;
  uVar28 = *(uint *)((long)__s + 0xb8) & 0xffff00ff | (*(uint *)((long)hal + 0x340) & 0xff) << 8;
  *(uint *)((long)__s + 0xb8) = uVar28;
  uVar28 = CONCAT31((int3)(uVar28 >> 8),*(undefined1 *)((long)hal + 0x348));
  *(uint *)((long)__s + 0xb8) = uVar28;
  uVar24 = *(int *)((long)hal + 0x33c) << 0x18;
  *(uint *)((long)__s + 0xb8) = uVar28 & 0xffffff | uVar24;
  *(uint *)((long)__s + 0xb8) =
       uVar28 & 0xffff | uVar24 | (*(uint *)((long)hal + 0x344) & 0xff) << 0x10;
  uVar28 = *(uint *)((long)__s + 0x148) & 0xffff00ff | (*(uint *)((long)hal + 0x350) & 0xff) << 8;
  *(uint *)((long)__s + 0x148) = uVar28;
  uVar28 = CONCAT31((int3)(uVar28 >> 8),*(undefined1 *)((long)hal + 0x358));
  *(uint *)((long)__s + 0x148) = uVar28;
  uVar24 = *(int *)((long)hal + 0x34c) << 0x18;
  *(uint *)((long)__s + 0x148) = uVar28 & 0xffffff | uVar24;
  *(uint *)((long)__s + 0x148) =
       uVar28 & 0xffff | uVar24 | (*(uint *)((long)hal + 0x354) & 0xff) << 0x10;
  uVar28 = *(uint *)((long)__s + 0x14c) & 0xffff00ff | (*(uint *)((long)hal + 0x360) & 0xff) << 8;
  *(uint *)((long)__s + 0x14c) = uVar28;
  uVar28 = CONCAT31((int3)(uVar28 >> 8),*(undefined1 *)((long)hal + 0x368));
  *(uint *)((long)__s + 0x14c) = uVar28;
  uVar24 = *(int *)((long)hal + 0x35c) << 0x18;
  *(uint *)((long)__s + 0x14c) = uVar28 & 0xffffff | uVar24;
  *(uint *)((long)__s + 0x14c) =
       uVar28 & 0xffff | uVar24 | (*(uint *)((long)hal + 0x364) & 0xff) << 0x10;
  *(undefined4 *)((long)__s + 0xb0) = *(undefined4 *)((long)hal + 0x394);
  mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x50),0x2c,*(RK_U32 *)((long)hal + 0x3b4));
  *(undefined4 *)((long)__s + 0xb4) = *(undefined4 *)((long)hal + 0x398);
  mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x50),0x2d,*(RK_U32 *)((long)hal + 0x3b8));
  *(undefined4 *)((long)__s + 0x1b0) = *(undefined4 *)((long)hal + 0x37c);
  uVar24 = *(uint *)((long)hal + 0x4b4) & 0xfff;
  uVar28 = *(uint *)((long)__s + 0x84);
  *(uint *)((long)__s + 0x84) = uVar28 & 0xfffff000 | uVar24;
  *(uint *)((long)__s + 0x84) =
       uVar28 & 0xf000f000 | uVar24 | (*(uint *)((long)hal + 0x4b8) & 0xfff) << 0x10;
  uVar24 = *(uint *)((long)hal + 0x4bc) & 0xfff;
  uVar28 = *(uint *)((long)__s + 0x88);
  *(uint *)((long)__s + 0x88) = uVar28 & 0xfffff000 | uVar24;
  *(uint *)((long)__s + 0x88) =
       uVar28 & 0xf000f000 | uVar24 | (*(uint *)((long)hal + 0x4c0) & 0xfff) << 0x10;
  for (lVar29 = 0; lVar29 != 5; lVar29 = lVar29 + 1) {
    uVar24 = *(uint *)((long)hal + lVar29 * 8 + 0x4c4) & 0xfff;
    uVar28 = *(uint *)((long)__s + lVar29 * 4 + 0x70);
    *(uint *)((long)__s + lVar29 * 4 + 0x70) = uVar28 & 0xfffff000 | uVar24;
    *(uint *)((long)__s + lVar29 * 4 + 0x70) =
         uVar28 & 0xf000f000 | uVar24 | (*(uint *)((long)hal + lVar29 * 8 + 0x4c8) & 0xfff) << 0x10;
  }
  uVar24 = (*(uint *)((long)hal + 0x47c) & 1) << 0x1d;
  uVar28 = *(uint *)((long)__s + 0x11c);
  *(uint *)((long)__s + 0x11c) = uVar28 & 0xdfffffff | uVar24;
  *(uint *)((long)__s + 0x11c) =
       uVar28 & 0x9fffffff | uVar24 | (*(uint *)((long)hal + 0x480) & 1) << 0x1e;
  *(undefined4 *)((long)__s + 0x6c) = *(undefined4 *)((long)hal + 0x380);
  puVar22 = (uint *)((long)__s + 0x20);
  for (lVar29 = 0; lVar29 != 3; lVar29 = lVar29 + 1) {
    uVar24 = *(ushort *)((long)hal + lVar29 * 2 + 0x3d6) & 0x3fff;
    uVar28 = puVar22[-8];
    puVar22[-8] = uVar28 & 0xffffc000 | uVar24;
    puVar22[-8] = uVar28 & 0xc000c000 | uVar24 |
                  (*(ushort *)((long)hal + lVar29 * 2 + 0x3e6) & 0x3fff) << 0x10;
    uVar24 = *(ushort *)((long)hal + lVar29 * 2 + 0x3f6) & 0x3fff;
    uVar28 = puVar22[-7];
    puVar22[-7] = uVar28 & 0xffffc000 | uVar24;
    puVar22[-7] = uVar28 & 0xc000c000 | uVar24 |
                  (*(ushort *)((long)hal + lVar29 * 2 + 0x3de) & 0x3fff) << 0x10;
    uVar24 = *(ushort *)((long)hal + lVar29 * 2 + 0x3ee) & 0x3fff;
    uVar28 = puVar22[-6];
    puVar22[-6] = uVar28 & 0xffffc000 | uVar24;
    puVar22[-6] = uVar28 & 0xc000c000 | uVar24 |
                  (*(ushort *)((long)hal + lVar29 * 2 + 0x3fe) & 0x3fff) << 0x10;
    uVar24 = *(ushort *)((long)hal + lVar29 * 2 + 0x406) & 0x1ff;
    uVar28 = puVar22[-5];
    puVar22[-5] = uVar28 & 0xfffffe00 | uVar24;
    uVar26 = (*(ushort *)((long)hal + lVar29 * 2 + 0x416) & 0x1ff) << 9;
    puVar22[-5] = uVar28 & 0xfffc0000 | uVar24 | uVar26;
    puVar22[-5] = uVar28 & 0xf8000000 | uVar24 | uVar26 |
                  (*(ushort *)((long)hal + lVar29 * 2 + 0x426) & 0x1ff) << 0x12;
    uVar24 = *(ushort *)((long)hal + lVar29 * 2 + 0x40e) & 0x1ff;
    uVar28 = puVar22[-4];
    puVar22[-4] = uVar28 & 0xfffffe00 | uVar24;
    uVar26 = (*(ushort *)((long)hal + lVar29 * 2 + 0x41e) & 0x1ff) << 9;
    puVar22[-4] = uVar28 & 0xfffc0000 | uVar24 | uVar26;
    puVar22[-4] = uVar28 & 0xf8000000 | uVar24 | uVar26 |
                  (*(ushort *)((long)hal + lVar29 * 2 + 0x42e) & 0x1ff) << 0x12;
    uVar28 = CONCAT31((int3)(puVar22[-3] >> 8),*(undefined1 *)((long)hal + lVar29 + 0x435));
    puVar22[-3] = uVar28;
    uVar24 = (uint)*(byte *)((long)hal + lVar29 + 0x43d) << 8;
    puVar22[-3] = uVar28 & 0xffff00ff | uVar24;
    puVar22[-3] = uVar28 & 0xff0000ff | uVar24 | (uint)*(byte *)((long)hal + lVar29 + 0x445) << 0x10
    ;
    uVar28 = CONCAT31((int3)(puVar22[-2] >> 8),*(undefined1 *)((long)hal + lVar29 + 0x439));
    puVar22[-2] = uVar28;
    uVar24 = (uint)*(byte *)((long)hal + lVar29 + 0x441) << 8;
    puVar22[-2] = uVar28 & 0xffff00ff | uVar24;
    puVar22[-2] = uVar28 & 0xff0000ff | uVar24 | (uint)*(byte *)((long)hal + lVar29 + 0x449) << 0x10
    ;
    uVar28 = CONCAT31((int3)(puVar22[-1] >> 8),*(undefined1 *)((long)hal + lVar29 * 2 + 0x44e));
    puVar22[-1] = uVar28;
    uVar24 = (*(ushort *)((long)hal + lVar29 * 2 + 0x45e) & 0x1ff) << 8;
    puVar22[-1] = uVar28 & 0xfffe00ff | uVar24;
    uVar26 = (uint)*(byte *)((long)hal + lVar29 * 2 + 0x46e) << 0x11;
    puVar22[-1] = uVar28 & 0xfe0000ff | uVar24 | uVar26;
    puVar22[-1] = uVar28 & 0x800000ff | uVar24 | uVar26 |
                  (*(uint *)((long)hal + lVar29 * 4 + 0x4a4) & 0x3f) << 0x19;
    uVar24 = *(ushort *)((long)hal + lVar29 * 2 + 0x456) & 0x1ff;
    uVar28 = *puVar22;
    *puVar22 = uVar28 & 0xfffffe00 | uVar24;
    uVar26 = (*(ushort *)((long)hal + lVar29 * 2 + 0x466) & 0x1ff) << 9;
    *puVar22 = uVar28 & 0xfffc0000 | uVar24 | uVar26;
    *puVar22 = uVar28 & 0xf8000000 | uVar24 | uVar26 |
               (*(ushort *)((long)hal + lVar29 * 2 + 0x476) & 0x1ff) << 0x12;
    puVar22 = puVar22 + 9;
  }
  uVar26 = (*(uint *)((long)hal + 0x504) & 0x7f) << 0x10;
  uVar28 = *(uint *)((long)__s + 0xa0);
  *(uint *)((long)__s + 0xa0) = uVar28 & 0xff80ffff | uVar26;
  uVar27 = (*(uint *)((long)hal + 0x508) & 0x7f) << 8;
  uVar24 = *(uint *)((long)__s + 0xa8);
  *(uint *)((long)__s + 0xa8) = uVar24 & 0xffff80ff | uVar27;
  uVar11 = *(uint *)((long)hal + 0x50c) & 0x7f;
  *(uint *)((long)__s + 0xa8) = uVar24 & 0xffff8080 | uVar27 | uVar11;
  *(uint *)((long)__s + 0xa8) =
       uVar24 & 0xff808080 | uVar27 | uVar11 | (*(uint *)((long)hal + 0x510) & 0x7f) << 0x10;
  *(uint *)((long)__s + 0xa0) =
       uVar28 & 0x8080ffff | uVar26 | (*(uint *)((long)hal + 0x514) & 0x7f) << 0x18;
  uVar24 = (*(uint *)((long)hal + 0x518) & 0x7f) << 8;
  uVar28 = *(uint *)((long)__s + 0xac);
  *(uint *)((long)__s + 0xac) = uVar28 & 0xffff80ff | uVar24;
  uVar26 = *(uint *)((long)hal + 0x51c) & 0x7f;
  *(uint *)((long)__s + 0xac) = uVar28 & 0xffff8080 | uVar24 | uVar26;
  *(uint *)((long)__s + 0xac) =
       uVar28 & 0xff808080 | uVar24 | uVar26 | (*(uint *)((long)hal + 0x520) & 0x7f) << 0x10;
  for (lVar29 = -0x20; lVar29 != 0; lVar29 = lVar29 + 1) {
    uVar1 = *(undefined1 *)((long)hal + lVar29 * 4 + 0x27b);
    uVar28 = CONCAT31((int3)((uint)*(undefined4 *)((long)__s + lVar29 * 4 + 0x260) >> 8),uVar1);
    *(uint *)((long)__s + lVar29 * 4 + 0x260) = uVar28;
    bVar2 = *(byte *)((long)hal + lVar29 * 4 + 0x27a);
    uVar24 = (uint)bVar2 << 8;
    *(uint *)((long)__s + lVar29 * 4 + 0x260) = uVar28 & 0xffff00ff | uVar24;
    bVar3 = *(byte *)((long)hal + lVar29 * 4 + 0x279);
    *(uint *)((long)__s + lVar29 * 4 + 0x260) = uVar28 & 0xff0000ff | uVar24 | (uint)bVar3 << 0x10;
    *(uint *)((long)__s + lVar29 * 4 + 0x260) =
         CONCAT13(*(undefined1 *)((long)hal + lVar29 * 4 + 0x278),
                  CONCAT12(bVar3,CONCAT11(bVar2,uVar1)));
    uVar1 = *(undefined1 *)((long)hal + lVar29 * 4 + 0x2fb);
    uVar28 = CONCAT31((int3)((uint)*(undefined4 *)((long)__s + lVar29 * 4 + 0x2e0) >> 8),uVar1);
    *(uint *)((long)__s + lVar29 * 4 + 0x2e0) = uVar28;
    bVar2 = *(byte *)((long)hal + lVar29 * 4 + 0x2fa);
    uVar24 = (uint)bVar2 << 8;
    *(uint *)((long)__s + lVar29 * 4 + 0x2e0) = uVar28 & 0xffff00ff | uVar24;
    bVar3 = *(byte *)((long)hal + lVar29 * 4 + 0x2f9);
    *(uint *)((long)__s + lVar29 * 4 + 0x2e0) = uVar28 & 0xff0000ff | uVar24 | (uint)bVar3 << 0x10;
    *(uint *)((long)__s + lVar29 * 4 + 0x2e0) =
         CONCAT13(*(undefined1 *)((long)hal + lVar29 * 4 + 0x2f8),
                  CONCAT12(bVar3,CONCAT11(bVar2,uVar1)));
  }
  *(byte *)((long)__s + 0x19c) = *(byte *)((long)__s + 0x19c) | 1;
  return MPP_OK;
}

Assistant:

static MPP_RET hal_vp8e_vepu2_gen_regs_v2(void *hal, HalEncTask *task)
{
    MPP_RET ret = MPP_OK;
    HalVp8eCtx *ctx = (HalVp8eCtx *)hal;

    ctx->rc->qp_hdr = MPP_CLIP3(0, 127, task->rc_task->info.quality_target);

    if (!ctx->buffer_ready) {
        ret = hal_vp8e_setup(hal);
        if (ret) {
            mpp_err("failed to init hal vp8e\n");
            return ret;
        } else {
            ctx->buffer_ready = 1;
        }
    }

    memset(ctx->stream_size, 0, sizeof(ctx->stream_size));

    hal_vp8e_enc_strm_code(ctx, task);
    vp8e_vpu_frame_start(ctx);

    return MPP_OK;
}